

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O3

self * __thiscall
boost::python::
class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
::add_property<long_timestamp_t::*>
          (class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,offset_in_timestamp_t_to_long fget,char *docstr)

{
  vector2<long_&,_timestamp_t_&> local_2a [2];
  long *local_28;
  
  detail::
  make_function_aux<boost::python::detail::member<long,timestamp_t>,boost::python::return_value_policy<boost::python::return_by_value,boost::python::default_call_policies>,boost::mpl::vector2<long&,timestamp_t&>>
            ((member<long,_timestamp_t>)&local_28,
             (return_value_policy<boost::python::return_by_value,_boost::python::default_call_policies>
              *)fget,local_2a);
  objects::class_base::add_property(&this->super_class_base,name,(object *)&local_28,docstr);
  *local_28 = *local_28 + -1;
  if (*local_28 == 0) {
    _Py_Dealloc();
  }
  return this;
}

Assistant:

self& add_property(char const* name, Get fget, char const* docstr = 0)
    {
        base::add_property(name, this->make_getter(fget), docstr);
        return *this;
    }